

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::dump
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *poVar3;
  ostream *in_RSI;
  sc_logic *in_stack_ffffffffffffffd8;
  
  poVar1 = std::operator<<(in_RSI,"     name = ");
  pcVar2 = sc_object::name((sc_object *)0x2347dc);
  poVar3 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"    value = ");
  poVar3 = sc_dt::operator<<(poVar1,in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"new value = ");
  poVar1 = sc_dt::operator<<(poVar1,in_stack_ffffffffffffffd8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
sc_signal_t<T,POL>::dump( ::std::ostream& os ) const
{
    os << "     name = " << name() << ::std::endl;
    os << "    value = " << m_cur_val << ::std::endl;
    os << "new value = " << m_new_val << ::std::endl;
}